

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall
FIX::Acceptor::Acceptor
          (Acceptor *this,Application *application,MessageStoreFactory *messageStoreFactory,
          SessionSettings *settings)

{
  SessionSettings *settings_local;
  MessageStoreFactory *messageStoreFactory_local;
  Application *application_local;
  Acceptor *this_local;
  
  this->_vptr_Acceptor = (_func_int **)&PTR__Acceptor_0032f1d8;
  this->m_threadid = 0;
  std::
  map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::map(&this->m_sessions);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (&this->m_sessionIDs);
  this->m_application = application;
  this->m_messageStoreFactory = messageStoreFactory;
  SessionSettings::SessionSettings(&this->m_settings,settings);
  this->m_pLogFactory = (LogFactory *)0x0;
  this->m_pLog = (Log *)0x0;
  NullLog::NullLog(&this->m_nullLog);
  std::atomic<bool>::atomic(&this->m_processing,false);
  std::atomic<bool>::atomic(&this->m_firstPoll,true);
  std::atomic<bool>::atomic(&this->m_stop,true);
  initialize(this);
  return;
}

Assistant:

EXCEPT(ConfigError)
    : m_threadid(0),
      m_application(application),
      m_messageStoreFactory(messageStoreFactory),
      m_settings(settings),
      m_pLogFactory(0),
      m_pLog(0),
      m_processing(false),
      m_firstPoll(true),
      m_stop(true) {
  initialize();
}